

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u32 XXH32_endian_align(xxh_u8 *input,size_t len,xxh_u32 seed,XXH_alignment align)

{
  xxh_u32 xVar1;
  xxh_u32 xVar2;
  xxh_u32 xVar3;
  xxh_u32 input_00;
  xxh_u32 in_EDX;
  ulong in_RSI;
  ulong in_RDI;
  xxh_u32 v4;
  xxh_u32 v3;
  xxh_u32 v2;
  xxh_u32 v1;
  xxh_u8 *limit;
  xxh_u32 h32;
  xxh_u8 *bEnd;
  undefined4 in_stack_ffffffffffffffa8;
  XXH_alignment in_stack_ffffffffffffffac;
  xxh_u32 in_stack_ffffffffffffffb0;
  xxh_u32 in_stack_ffffffffffffffb4;
  xxh_u32 in_stack_ffffffffffffffb8;
  xxh_u32 in_stack_ffffffffffffffbc;
  xxh_u32 in_stack_ffffffffffffffc0;
  xxh_u32 local_3c;
  xxh_u32 local_38;
  xxh_u32 local_34;
  ulong local_8;
  
  if (0xf < in_RSI) {
    in_stack_ffffffffffffffc0 = in_EDX + 0x61c8864f;
    local_3c = in_EDX;
    local_38 = in_EDX + 0x85ebca77;
    local_34 = in_EDX + 0x24234428;
    local_8 = in_RDI;
    do {
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffc0;
      xVar1 = XXH_readLE32_align((void *)CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8),XXH_aligned);
      xVar1 = XXH32_round(local_34,xVar1);
      xVar2 = XXH_readLE32_align((void *)CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8),XXH_aligned);
      xVar2 = XXH32_round(local_38,xVar2);
      xVar3 = XXH_readLE32_align((void *)CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8),XXH_aligned);
      xVar3 = XXH32_round(local_3c,xVar3);
      input_00 = XXH_readLE32_align((void *)CONCAT44(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8),XXH_aligned);
      in_stack_ffffffffffffffc0 = XXH32_round(in_stack_ffffffffffffffbc,input_00);
      local_8 = local_8 + 0x10;
      in_stack_ffffffffffffffb0 = local_34;
      in_stack_ffffffffffffffb4 = local_38;
      in_stack_ffffffffffffffb8 = local_3c;
      local_3c = xVar3;
      local_38 = xVar2;
      local_34 = xVar1;
    } while (local_8 < (in_RDI + in_RSI) - 0xf);
  }
  xVar1 = XXH32_finalize(in_stack_ffffffffffffffc0,
                         (xxh_u8 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
  return xVar1;
}

Assistant:

XXH_FORCE_INLINE xxh_u32 XXH32_endian_align(const xxh_u8* input, size_t len,
                                            xxh_u32 seed, XXH_alignment align) {
  const xxh_u8* bEnd = input + len;
  xxh_u32 h32;

#if defined(XXH_ACCEPT_NULL_INPUT_POINTER) && \
    (XXH_ACCEPT_NULL_INPUT_POINTER >= 1)
  if (input == NULL) {
    len = 0;
    bEnd = input = (const xxh_u8*)(size_t)16;
  }
#endif

  if (len >= 16) {
    const xxh_u8* const limit = bEnd - 15;
    xxh_u32 v1 = seed + XXH_PRIME32_1 + XXH_PRIME32_2;
    xxh_u32 v2 = seed + XXH_PRIME32_2;
    xxh_u32 v3 = seed + 0;
    xxh_u32 v4 = seed - XXH_PRIME32_1;

    do {
      v1 = XXH32_round(v1, XXH_get32bits(input));
      input += 4;
      v2 = XXH32_round(v2, XXH_get32bits(input));
      input += 4;
      v3 = XXH32_round(v3, XXH_get32bits(input));
      input += 4;
      v4 = XXH32_round(v4, XXH_get32bits(input));
      input += 4;
    } while (input < limit);

    h32 = XXH_rotl32(v1, 1) + XXH_rotl32(v2, 7) + XXH_rotl32(v3, 12) +
          XXH_rotl32(v4, 18);
  } else {
    h32 = seed + XXH_PRIME32_5;
  }

  h32 += (xxh_u32)len;

  return XXH32_finalize(h32, input, len & 15, align);
}